

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int google::protobuf::io::CodedOutputStream::VarintSize32Fallback(uint32 value)

{
  undefined4 local_c;
  uint32 value_local;
  
  if (value < 0x80) {
    local_c = 1;
  }
  else if (value < 0x4000) {
    local_c = 2;
  }
  else if (value < 0x200000) {
    local_c = 3;
  }
  else if (value < 0x10000000) {
    local_c = 4;
  }
  else {
    local_c = 5;
  }
  return local_c;
}

Assistant:

int CodedOutputStream::VarintSize32Fallback(uint32 value) {
  if (value < (1 << 7)) {
    return 1;
  } else if (value < (1 << 14)) {
    return 2;
  } else if (value < (1 << 21)) {
    return 3;
  } else if (value < (1 << 28)) {
    return 4;
  } else {
    return 5;
  }
}